

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O2

void __thiscall NoiseSource::NoiseSource(NoiseSource *this,Time *time,Matrix *a)

{
  allocator<char> local_15a;
  allocator<char> local_159;
  string local_158;
  string local_138;
  Matrix local_118;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"",&local_159);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"Stochastic",&local_15a);
  StochasticProcess::StochasticProcess(&this->super_StochasticProcess,time,&local_138,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  RandN::RandN((RandN *)this);
  (this->super_StochasticProcess).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__NoiseSource_001562b8;
  (this->super_StochasticProcess).super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__NoiseSource_00156340;
  (this->super_StochasticProcess).super_Physical._vptr_Physical =
       (_func_int **)&PTR__NoiseSource_00156388;
  Matrix::Matrix(&local_118,a);
  setMixingMatrix(this,&local_118);
  Matrix::~Matrix(&local_118);
  return;
}

Assistant:

NoiseSource::NoiseSource(Time *time, Matrix a )
	: StochasticProcess(time)
{
	setMixingMatrix(a);
}